

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsecontext.cpp
# Opt level: O0

bool __thiscall FParseContext::FindSym(FParseContext *this,char *sym,FParseSymbol **val)

{
  uint uVar1;
  int iVar2;
  FParseSymbol *pFVar3;
  uint local_2c;
  uint i;
  FParseSymbol **val_local;
  char *sym_local;
  FParseContext *this_local;
  
  local_2c = 0;
  while( true ) {
    uVar1 = TArray<FParseSymbol,_FParseSymbol>::Size(&this->symbols);
    if (uVar1 <= local_2c) {
      return false;
    }
    pFVar3 = TArray<FParseSymbol,_FParseSymbol>::operator[](&this->symbols,(ulong)local_2c);
    iVar2 = strcmp(pFVar3->Sym,sym);
    if (iVar2 == 0) break;
    local_2c = local_2c + 1;
  }
  pFVar3 = TArray<FParseSymbol,_FParseSymbol>::operator[](&this->symbols,(ulong)local_2c);
  *val = pFVar3;
  return true;
}

Assistant:

bool FParseContext::FindSym (char *sym, FParseSymbol **val)
{
	for(unsigned i=0;i<symbols.Size(); i++)
	{
		if (strcmp (symbols[i].Sym, sym) == 0)
		{
			*val = &symbols[i];
			return true;
		}
	}
	return false;
}